

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindNode(Binder *this,QueryNode *node)

{
  QueryNodeType QVar1;
  QueryNode *in_RDX;
  element_type *local_20;
  
  AddCTEMap((Binder *)node,&in_RDX->cte_map);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  QVar1 = in_RDX->type;
  if (QVar1 == CTE_NODE) {
    QueryNode::Cast<duckdb::CTENode>(in_RDX);
    BindNode((Binder *)&stack0xffffffffffffffe0,(CTENode *)node);
  }
  else if (QVar1 == RECURSIVE_CTE_NODE) {
    QueryNode::Cast<duckdb::RecursiveCTENode>(in_RDX);
    BindNode((Binder *)&stack0xffffffffffffffe0,(RecursiveCTENode *)node);
  }
  else if (QVar1 == SELECT_NODE) {
    QueryNode::Cast<duckdb::SelectNode>(in_RDX);
    BindNode((Binder *)&stack0xffffffffffffffe0,(SelectNode *)node);
  }
  else {
    QueryNode::Cast<duckdb::SetOperationNode>(in_RDX);
    BindNode((Binder *)&stack0xffffffffffffffe0,(SetOperationNode *)node);
  }
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)this;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindNode(QueryNode &node) {
	// first we visit the set of CTEs and add them to the bind context
	AddCTEMap(node.cte_map);
	// now we bind the node
	unique_ptr<BoundQueryNode> result;
	switch (node.type) {
	case QueryNodeType::SELECT_NODE:
		result = BindNode(node.Cast<SelectNode>());
		break;
	case QueryNodeType::RECURSIVE_CTE_NODE:
		result = BindNode(node.Cast<RecursiveCTENode>());
		break;
	case QueryNodeType::CTE_NODE:
		result = BindNode(node.Cast<CTENode>());
		break;
	default:
		D_ASSERT(node.type == QueryNodeType::SET_OPERATION_NODE);
		result = BindNode(node.Cast<SetOperationNode>());
		break;
	}
	return result;
}